

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

void __thiscall
cmsys::CommandLineArguments::AddArgument
          (CommandLineArguments *this,char *argument,ArgumentTypeEnum type,VariableTypeEnum vtype,
          void *variable,char *help)

{
  Internal *pIVar1;
  mapped_type *pmVar2;
  allocator local_61;
  void *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pIVar1 = this->Internals;
  local_60 = variable;
  local_58 = help;
  std::__cxx11::string::string((string *)local_50,argument,&local_61);
  pmVar2 = std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](&(pIVar1->Callbacks).
                         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                        ,(key_type *)local_50);
  pmVar2->Argument = argument;
  pmVar2->ArgumentType = type;
  pmVar2->Callback = (CallbackType)0x0;
  pmVar2->CallData = (void *)0x0;
  pmVar2->Variable = local_60;
  pmVar2->VariableType = vtype;
  pmVar2->Help = local_58;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  GenerateHelp(this);
  return;
}

Assistant:

void CommandLineArguments::AddArgument(const char* argument, ArgumentTypeEnum type,
  VariableTypeEnum vtype, void* variable, const char* help)
{
  CommandLineArgumentsCallbackStructure s;
  s.Argument     = argument;
  s.ArgumentType = type;
  s.Callback     = 0;
  s.CallData     = 0;
  s.VariableType = vtype;
  s.Variable     = variable;
  s.Help         = help;

  this->Internals->Callbacks[argument] = s;
  this->GenerateHelp();
}